

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O1

dict_insert_result wb_tree_insert(wb_tree *tree,void *key)

{
  wb_node *pwVar1;
  size_t sVar2;
  dict_compare_func p_Var3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  wb_node *pwVar9;
  void **ppvVar10;
  dict_compare_func p_Var11;
  int iVar12;
  long lVar13;
  int iVar14;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar15;
  ulong uVar16;
  void *key_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int iVar17;
  int iVar18;
  wb_tree *tree_00;
  void **ppvVar19;
  wb_node *n;
  dict_insert_result dVar20;
  dict_insert_result dVar21;
  dict_insert_result dVar22;
  
  pwVar9 = tree->root;
  if (tree->root == (wb_node *)0x0) {
    lVar13 = 0x20;
    n = (wb_node *)0x0;
    tree_00 = (wb_tree *)key;
  }
  else {
    do {
      n = pwVar9;
      tree_00 = (wb_tree *)n->key;
      uVar7 = (*tree->cmp_func)(key,tree_00);
      if ((int)uVar7 < 0) {
        lVar13 = 0x18;
      }
      else {
        lVar13 = 0x20;
        if (uVar7 == 0) {
          ppvVar19 = &n->datum;
          uVar15 = 0;
          goto LAB_00106643;
        }
      }
      pwVar9 = *(wb_node **)((long)&n->key + lVar13);
    } while (pwVar9 != (wb_node *)0x0);
    lVar13 = (ulong)(~uVar7 >> 0x1f) * 8 + 0x18;
  }
  ppvVar19 = (void **)0x30;
  pwVar9 = (wb_node *)(*dict_malloc_func)(0x30);
  if (pwVar9 == (wb_node *)0x0) {
    ppvVar19 = (void **)0x0;
    uVar15 = 0;
    goto LAB_00106643;
  }
  pwVar9->key = key;
  pwVar9->datum = (void *)0x0;
  pwVar9->parent = (wb_node *)0x0;
  pwVar9->llink = (wb_node *)0x0;
  pwVar9->rlink = (wb_node *)0x0;
  pwVar9->weight = 2;
  pwVar9->parent = n;
  if (n != (wb_node *)0x0) {
    *(wb_node **)((long)&n->key + lVar13) = pwVar9;
    uVar7 = 0;
    do {
      pwVar1 = n->parent;
      n->weight = n->weight + 1;
      uVar8 = fixup(tree,n);
      uVar7 = uVar7 + uVar8;
      n = pwVar1;
    } while (pwVar1 != (wb_node *)0x0);
    tree->rotation_count = tree->rotation_count + (ulong)uVar7;
    uVar15 = extraout_RDX_00;
LAB_00106639:
    tree->count = tree->count + 1;
    ppvVar19 = &pwVar9->datum;
    uVar15 = CONCAT71((int7)((ulong)uVar15 >> 8),1);
LAB_00106643:
    dVar20._8_8_ = uVar15;
    dVar20.datum_ptr = ppvVar19;
    return dVar20;
  }
  if (tree->count == 0) {
    if (tree->root == (wb_node *)0x0) {
      tree->root = pwVar9;
      uVar15 = extraout_RDX;
      goto LAB_00106639;
    }
  }
  else {
    wb_tree_insert_cold_1();
  }
  wb_tree_insert_cold_2();
  sVar2 = tree_00->rotation_count;
  if (sVar2 == 0) {
    uVar7 = 1000;
  }
  else {
    uVar7 = *(int *)(sVar2 + 0x28) * 1000;
  }
  iVar18 = (int)tree_00[1].count;
  if (uVar7 < (uint)(iVar18 * 0x125)) {
    lVar13 = (long)tree_00[1].root;
    if (lVar13 == 0) {
      fixup_cold_4();
      goto LAB_001068ef;
    }
    p_Var11 = *(dict_compare_func *)(lVar13 + 0x18);
    if (p_Var11 == (dict_compare_func)0x0) {
      uVar7 = 1000;
    }
    else {
      uVar7 = *(int *)(p_Var11 + 0x28) * 1000;
    }
    if (uVar7 < (uint)(*(int *)(lVar13 + 0x28) * 0x24a)) {
      tree_node_rot_left(ppvVar19,tree_00);
      iVar12 = 1;
      iVar18 = 1;
      if (tree_00->rotation_count != 0) {
        iVar18 = *(int *)(tree_00->rotation_count + 0x28);
      }
      if (tree_00[1].root != (wb_node *)0x0) {
        iVar12 = *(int *)((long)tree_00[1].root + 0x28);
      }
      *(int *)&tree_00[1].count = iVar12 + iVar18;
      ppvVar10 = (void **)0x1;
      iVar14 = 1;
      if (*(long *)(lVar13 + 0x20) != 0) {
        iVar14 = *(int *)(*(long *)(lVar13 + 0x20) + 0x28);
      }
      uVar7 = iVar14 + iVar12 + iVar18;
      uVar16 = (ulong)uVar7;
      *(uint *)(lVar13 + 0x28) = uVar7;
      goto LAB_001068e5;
    }
    if (p_Var11 != (dict_compare_func)0x0) {
      p_Var3 = tree_00->cmp_func;
      *(dict_compare_func *)(p_Var11 + 0x10) = p_Var3;
      if (p_Var3 != (dict_compare_func)0x0) {
        ppvVar19 = (void **)(p_Var3 + 0x20);
        if (*(wb_tree **)(p_Var3 + 0x18) == tree_00) {
          ppvVar19 = (void **)(p_Var3 + 0x18);
        }
      }
      *ppvVar19 = p_Var11;
      lVar4 = *(long *)(p_Var11 + 0x18);
      *(wb_tree **)(p_Var11 + 0x18) = tree_00;
      tree_00->cmp_func = p_Var11;
      tree_00[1].root = (wb_node *)lVar4;
      if (lVar4 != 0) {
        *(wb_tree **)(lVar4 + 0x10) = tree_00;
      }
      lVar5 = *(long *)(p_Var11 + 0x20);
      *(long *)(p_Var11 + 0x20) = lVar13;
      *(dict_compare_func *)(lVar13 + 0x10) = p_Var11;
      *(long *)(lVar13 + 0x18) = lVar5;
      if (lVar5 != 0) {
        *(long *)(lVar5 + 0x10) = lVar13;
      }
      iVar12 = 1;
      iVar18 = 1;
      if (tree_00->rotation_count != 0) {
        iVar18 = *(int *)(tree_00->rotation_count + 0x28);
      }
      if (lVar4 != 0) {
        iVar12 = *(int *)(lVar4 + 0x28);
      }
      *(int *)&tree_00[1].count = iVar12 + iVar18;
      iVar17 = 1;
      iVar14 = 1;
      if (lVar5 != 0) {
        iVar14 = *(int *)(lVar5 + 0x28);
      }
      uVar16 = *(ulong *)(lVar13 + 0x20);
      if (uVar16 != 0) {
        iVar17 = *(int *)(uVar16 + 0x28);
      }
      *(int *)(lVar13 + 0x28) = iVar17 + iVar14;
      iVar18 = iVar17 + iVar14 + iVar12 + iVar18;
      goto LAB_001068dd;
    }
  }
  else {
    uVar8 = iVar18 * 0x2c3;
    uVar16 = (ulong)uVar8;
    ppvVar10 = (void **)0x0;
    if (uVar7 <= uVar8) goto LAB_001068e5;
    if (sVar2 != 0) {
      if (*(long *)(sVar2 + 0x18) == 0) {
        iVar18 = 1;
      }
      else {
        iVar18 = *(int *)(*(long *)(sVar2 + 0x18) + 0x28);
      }
      if ((uint)(*(int *)(sVar2 + 0x28) * 0x19e) < (uint)(iVar18 * 1000)) {
        tree_node_rot_right(ppvVar19,tree_00);
        iVar14 = 1;
        iVar12 = 1;
        if (tree_00->rotation_count != 0) {
          iVar12 = *(int *)(tree_00->rotation_count + 0x28);
        }
        uVar16 = (ulong)tree_00[1].root;
        if (uVar16 != 0) {
          iVar14 = *(int *)(uVar16 + 0x28);
        }
        *(int *)&tree_00[1].count = iVar14 + iVar12;
        *(int *)(sVar2 + 0x28) = iVar14 + iVar12 + iVar18;
        ppvVar10 = (void **)0x1;
        goto LAB_001068e5;
      }
      p_Var11 = *(dict_compare_func *)(sVar2 + 0x20);
      if (p_Var11 == (dict_compare_func)0x0) goto LAB_001068f9;
      p_Var3 = tree_00->cmp_func;
      *(dict_compare_func *)(p_Var11 + 0x10) = p_Var3;
      if (p_Var3 != (dict_compare_func)0x0) {
        ppvVar19 = (void **)(p_Var3 + 0x20);
        if (*(wb_tree **)(p_Var3 + 0x18) == tree_00) {
          ppvVar19 = (void **)(p_Var3 + 0x18);
        }
      }
      *ppvVar19 = p_Var11;
      lVar13 = *(long *)(p_Var11 + 0x18);
      *(size_t *)(p_Var11 + 0x18) = sVar2;
      *(dict_compare_func *)(sVar2 + 0x10) = p_Var11;
      *(long *)(sVar2 + 0x20) = lVar13;
      if (lVar13 != 0) {
        *(size_t *)(lVar13 + 0x10) = sVar2;
      }
      sVar6 = *(size_t *)(p_Var11 + 0x20);
      *(wb_tree **)(p_Var11 + 0x20) = tree_00;
      tree_00->cmp_func = p_Var11;
      tree_00->rotation_count = sVar6;
      iVar12 = 1;
      iVar18 = 1;
      if (sVar6 != 0) {
        *(wb_tree **)(sVar6 + 0x10) = tree_00;
        iVar18 = *(int *)(sVar6 + 0x28);
      }
      if (tree_00[1].root != (wb_node *)0x0) {
        iVar12 = *(int *)((long)tree_00[1].root + 0x28);
      }
      uVar7 = iVar12 + iVar18;
      uVar16 = (ulong)uVar7;
      *(uint *)&tree_00[1].count = uVar7;
      iVar12 = 1;
      iVar18 = 1;
      if (*(long *)(sVar2 + 0x18) != 0) {
        iVar18 = *(int *)(*(long *)(sVar2 + 0x18) + 0x28);
      }
      if (lVar13 != 0) {
        iVar12 = *(int *)(lVar13 + 0x28);
      }
      *(int *)(sVar2 + 0x28) = iVar12 + iVar18;
      iVar18 = iVar12 + iVar18 + uVar7;
LAB_001068dd:
      *(int *)(p_Var11 + 0x28) = iVar18;
      ppvVar10 = (void **)0x2;
LAB_001068e5:
      dVar21._8_8_ = uVar16;
      dVar21.datum_ptr = ppvVar10;
      return dVar21;
    }
LAB_001068ef:
    fixup_cold_2();
  }
  fixup_cold_3();
LAB_001068f9:
  fixup_cold_1();
  pwVar9 = (wb_node *)tree_search_node(tree_00,key_00);
  if (pwVar9 == (wb_node *)0x0) {
    *ppvVar19 = (void *)0x0;
    ppvVar19[1] = (void *)0x0;
    ppvVar19[2] = (void *)0x0;
    uVar15 = extraout_RDX_01;
  }
  else {
    *ppvVar19 = pwVar9->key;
    ppvVar19[1] = pwVar9->datum;
    *(code *)(ppvVar19 + 2) = (code)0x1;
    remove_node(tree_00,pwVar9);
    uVar15 = extraout_RDX_02;
  }
  dVar22._8_8_ = uVar15;
  dVar22.datum_ptr = ppvVar19;
  return dVar22;
}

Assistant:

dict_insert_result
wb_tree_insert(wb_tree* tree, void* key)
{
    int cmp = 0;

    wb_node* node = tree->root;
    wb_node* parent = NULL;
    while (node) {
	cmp = tree->cmp_func(key, node->key);
	if (cmp < 0) {
	    parent = node; node = node->llink;
	} else if (cmp) {
	    parent = node; node = node->rlink;
	} else
	    return (dict_insert_result) { &node->datum, false };
    }

    wb_node* const add = node = node_new(key);
    if (!add)
	return (dict_insert_result) { NULL, false };

    if (!(node->parent = parent)) {
	ASSERT(tree->count == 0);
	ASSERT(tree->root == NULL);
	tree->root = node;
    } else {
	if (cmp < 0)
	    parent->llink = node;
	else
	    parent->rlink = node;

	unsigned rotations = 0;
	while ((node = parent) != NULL) {
	    parent = node->parent;
	    ++node->weight;
	    rotations += fixup(tree, node);
	}
	tree->rotation_count += rotations;
    }
    tree->count++;
    return (dict_insert_result) { &add->datum, true };
}